

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void synthesisSjis(OpenJTalk *oj,char *txt)

{
  char *txt_00;
  
  txt_00 = convert_charset(txt,CS_SHIFT_JIS,CS_UTF_8);
  synthesis(oj,txt_00);
  free(txt_00);
  return;
}

Assistant:

void synthesisSjis(OpenJTalk *oj, const char *txt)
{
#if defined(_WIN32)
	if (g_verbose)
	{
		console_message("charset: SJIS\n");
	}
#endif
	char *txt_utf8 = sjistou8(txt);
	synthesis(oj, txt_utf8);
	free(txt_utf8);
}